

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  Descriptor *pDVar2;
  string *value1;
  FieldGenerator *pFVar3;
  size_t sVar4;
  int i_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined8 extraout_RDX_01;
  long lVar6;
  char *pcVar7;
  int i;
  ulong uVar8;
  int i_2;
  string local_50;
  
  pcVar7 = 
  "void $classname$::Swap($classname$* other) {\n  if (other == this) return;\n  InternalSwap(other);\n}\n"
  ;
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) != '\0') {
    pcVar7 = 
    "void $classname$::Swap($classname$* other) {\n  if (other == this) return;\n  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {\n    InternalSwap(other);\n  } else {\n    $classname$* temp = New(GetArenaNoVirtual());\n    temp->MergeFrom(*other);\n    other->CopyFrom(*this);\n    InternalSwap(temp);\n    if (GetArenaNoVirtual() == NULL) {\n      delete temp;\n    }\n  }\n}\nvoid $classname$::UnsafeArenaSwap($classname$* other) {\n  if (other == this) return;\n  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());\n  InternalSwap(other);\n}\n"
    ;
  }
  io::Printer::Print(printer,pcVar7,"classname",&this->classname_);
  io::Printer::Print(printer,"void $classname$::InternalSwap($classname$* other) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 2)) {
    pcVar7 = "GetReflection()->Swap(this, other);";
  }
  else {
    uVar5 = extraout_RDX;
    for (uVar8 = 0;
        ppFVar1 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
        uVar8 = uVar8 + 1) {
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,ppFVar1[uVar8]);
      (*pFVar3->_vptr_FieldGenerator[0xd])(pFVar3,printer);
      uVar5 = extraout_RDX_00;
    }
    lVar6 = 0;
    for (uVar8 = 0; pDVar2 = this->descriptor_, (long)uVar8 < (long)*(int *)(pDVar2 + 0x38);
        uVar8 = uVar8 + 1) {
      value1 = *(string **)(*(long *)(pDVar2 + 0x40) + lVar6);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(uVar8 & 0xffffffff),(int)uVar5);
      io::Printer::Print(printer,
                         "std::swap($oneof_name$_, other->$oneof_name$_);\nstd::swap(_oneof_case_[$i$], other->_oneof_case_[$i$]);\n"
                         ,"oneof_name",value1,"i",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar6 = lVar6 + 0x30;
      uVar5 = extraout_RDX_01;
    }
    if (*(int *)(*(long *)(pDVar2 + 0x10) + 0x8c) != 3) {
      uVar8 = 0;
      while( true ) {
        sVar4 = HasBitsSize(this);
        if (sVar4 >> 2 <= uVar8) break;
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(uVar8 & 0xffffffff),i_00);
        io::Printer::Print(printer,"std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n","i",
                           &local_50);
        std::__cxx11::string::~string((string *)&local_50);
        uVar8 = uVar8 + 1;
      }
      if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
        io::Printer::Print(printer,"_internal_metadata_.Swap(&other->_internal_metadata_);\n");
      }
    }
    io::Printer::Print(printer,"std::swap(_cached_size_, other->_cached_size_);\n");
    if (0 < *(int *)(this->descriptor_ + 0x68)) {
      io::Printer::Print(printer,"_extensions_.Swap(&other->_extensions_);\n");
    }
    if (this->num_weak_fields_ == 0) goto LAB_0027f489;
    pcVar7 = "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n";
  }
  io::Printer::Print(printer,pcVar7);
LAB_0027f489:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSwap(io::Printer* printer) {
  if (SupportsArenas(descriptor_)) {
    // Generate the Swap member function. This is a lightweight wrapper around
    // UnsafeArenaSwap() / MergeFrom() with temporaries, depending on the memory
    // ownership situation: swapping across arenas or between an arena and a
    // heap requires copying.
    printer->Print(
        "void $classname$::Swap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {\n"
        "    InternalSwap(other);\n"
        "  } else {\n"
        "    $classname$* temp = New(GetArenaNoVirtual());\n"
        "    temp->MergeFrom(*other);\n"
        "    other->CopyFrom(*this);\n"
        "    InternalSwap(temp);\n"
        "    if (GetArenaNoVirtual() == NULL) {\n"
        "      delete temp;\n"
        "    }\n"
        "  }\n"
        "}\n"
        "void $classname$::UnsafeArenaSwap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());\n"
        "  InternalSwap(other);\n"
        "}\n",
        "classname", classname_);
  } else {
    printer->Print(
        "void $classname$::Swap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  InternalSwap(other);\n"
        "}\n",
        "classname", classname_);
  }

  // Generate the UnsafeArenaSwap member function.
  printer->Print("void $classname$::InternalSwap($classname$* other) {\n",
                 "classname", classname_);
  printer->Indent();

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    for (int i = 0; i < optimized_order_.size(); i++) {
      // optimized_order_ does not contain oneof fields, but the field
      // generators for these fields do not emit swapping code on their own.
      const FieldDescriptor* field = optimized_order_[i];
      field_generators_.get(field).GenerateSwappingCode(printer);
    }

    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
        "std::swap($oneof_name$_, other->$oneof_name$_);\n"
        "std::swap(_oneof_case_[$i$], other->_oneof_case_[$i$]);\n",
        "oneof_name", descriptor_->oneof_decl(i)->name(),
        "i", SimpleItoa(i));
    }

    if (HasFieldPresence(descriptor_->file())) {
      for (int i = 0; i < HasBitsSize() / 4; ++i) {
        printer->Print("std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n",
                       "i", SimpleItoa(i));
      }
    }

    if (PreserveUnknownFields(descriptor_)) {
      printer->Print("_internal_metadata_.Swap(&other->_internal_metadata_);\n");
    }

    printer->Print("std::swap(_cached_size_, other->_cached_size_);\n");
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("_extensions_.Swap(&other->_extensions_);\n");
    }
    if (num_weak_fields_) {
      printer->Print(
          "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    printer->Print("GetReflection()->Swap(this, other);");
  }

  printer->Outdent();
  printer->Print("}\n");
}